

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

uv_stream_t * __thiscall anon_unknown.dwarf_2ab829::ImplPosix::GetWriter(ImplPosix *this)

{
  ImplPosix *this_local;
  
  if (this->Conn == FDs) {
    this_local = (ImplPosix *)::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&this->ConnWrite);
  }
  else if (this->Conn == FIFO) {
    this_local = (ImplPosix *)::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&this->ConnFIFO);
  }
  else {
    this_local = (ImplPosix *)0x0;
  }
  return (uv_stream_t *)this_local;
}

Assistant:

uv_stream_t* ImplPosix::GetWriter() const
{
  switch (this->Conn) {
    case Connection::FDs:
      return this->ConnWrite;
    case Connection::FIFO:
      return this->ConnFIFO;
    default:
      return nullptr;
  }
}